

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall Reducer::reduceUsingPasses(Reducer *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  reference pbVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_988;
  string local_750 [32];
  string local_730 [32];
  string local_710;
  ProgramResult local_6f0;
  string local_6c0 [32];
  ulong local_6a0;
  size_t newSize;
  ProgramResult local_678;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_648;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_628;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_608;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a8;
  allocator<char> local_581;
  string local_580 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  undefined1 local_540 [8];
  string currCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> pass;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_4e0 [7];
  bool more;
  ulong local_4c0;
  size_t oldSize;
  allocator<char> local_4b0;
  allocator<char> local_4af;
  allocator<char> local_4ae;
  allocator<char> local_4ad;
  allocator<char> local_4ac;
  allocator<char> local_4ab;
  allocator<char> local_4aa;
  allocator<char> local_4a9;
  allocator<char> local_4a8;
  allocator<char> local_4a7;
  allocator<char> local_4a6;
  allocator<char> local_4a5;
  allocator<char> local_4a4;
  allocator<char> local_4a3;
  allocator<char> local_4a2;
  allocator<char> local_4a1;
  allocator<char> local_4a0;
  allocator<char> local_49f;
  allocator<char> local_49e;
  allocator<char> local_49d;
  allocator<char> local_49c;
  allocator<char> local_49b;
  allocator<char> local_49a;
  allocator<char> local_499;
  allocator<char> local_498;
  allocator<char> local_497;
  allocator<char> local_496;
  allocator<char> local_495 [20];
  allocator<char> local_481;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  string local_458 [32];
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  iterator local_38;
  size_type local_30;
  undefined1 local_28 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  passes;
  Reducer *this_local;
  
  oldSize._2_1_ = 1;
  local_480 = &local_478;
  passes.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_478,"-Oz",&local_481);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_458;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_458,"-Os",local_495);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_438,"-O1",&local_496);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_418;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_418,"-O2",&local_497);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3f8,"-O3",&local_498);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3d8,"-O4",&local_499);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3b8,"--flatten -Os",&local_49a);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_398;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_398,"--flatten -O3",&local_49b);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_378,"--flatten --simplify-locals-notee-nostructure --local-cse -Os",&local_49c);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_358,"--coalesce-locals --vacuum",&local_49d);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_338,"--dae",&local_49e);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_318,"--dae-optimizing",&local_49f);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2f8,"--dce",&local_4a0);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_2d8,"--duplicate-function-elimination",&local_4a1);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2b8,"--gto",&local_4a2);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_298,"--inlining",&local_4a3);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_278,"--inlining-optimizing",&local_4a4);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_258,"--optimize-level=3 --inlining-optimizing",&local_4a5);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_238,"--local-cse",&local_4a6);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_218;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_218,"--memory-packing",&local_4a7);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8,"--remove-unused-names --merge-blocks --vacuum",&local_4a8);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1d8,"--optimize-instructions",&local_4a9)
  ;
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1b8,"--precompute",&local_4aa);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_198,"--remove-imports",&local_4ab);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_178,"--remove-memory",&local_4ac);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"--remove-unused-names --remove-unused-brs",&local_4ad);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_138,"--remove-unused-module-elements",&local_4ae);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"--remove-unused-nonfunction-module-elements",&local_4af);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"--reorder-functions",&local_4b0);
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8,"--reorder-locals",(allocator<char> *)((long)&oldSize + 7));
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"--simplify-globals",(allocator<char> *)((long)&oldSize + 6));
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"--simplify-locals --vacuum",(allocator<char> *)((long)&oldSize + 5));
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"--strip",(allocator<char> *)((long)&oldSize + 4));
  local_480 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"--vacuum",(allocator<char> *)((long)&oldSize + 3));
  oldSize._2_1_ = 0;
  local_38 = &local_478;
  local_30 = 0x22;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)((long)&oldSize + 1));
  __l._M_len = local_30;
  __l._M_array = local_38;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_28,__l,
           (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)((long)&oldSize + 1));
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)((long)&oldSize + 1));
  local_988 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_38;
  do {
    local_988 = local_988 + -1;
    std::__cxx11::string::~string((string *)local_988);
  } while (local_988 != &local_478);
  std::allocator<char>::~allocator((allocator<char> *)((long)&oldSize + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&oldSize + 4));
  std::allocator<char>::~allocator((allocator<char> *)((long)&oldSize + 5));
  std::allocator<char>::~allocator((allocator<char> *)((long)&oldSize + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&oldSize + 7));
  std::allocator<char>::~allocator(&local_4b0);
  std::allocator<char>::~allocator(&local_4af);
  std::allocator<char>::~allocator(&local_4ae);
  std::allocator<char>::~allocator(&local_4ad);
  std::allocator<char>::~allocator(&local_4ac);
  std::allocator<char>::~allocator(&local_4ab);
  std::allocator<char>::~allocator(&local_4aa);
  std::allocator<char>::~allocator(&local_4a9);
  std::allocator<char>::~allocator(&local_4a8);
  std::allocator<char>::~allocator(&local_4a7);
  std::allocator<char>::~allocator(&local_4a6);
  std::allocator<char>::~allocator(&local_4a5);
  std::allocator<char>::~allocator(&local_4a4);
  std::allocator<char>::~allocator(&local_4a3);
  std::allocator<char>::~allocator(&local_4a2);
  std::allocator<char>::~allocator(&local_4a1);
  std::allocator<char>::~allocator(&local_4a0);
  std::allocator<char>::~allocator(&local_49f);
  std::allocator<char>::~allocator(&local_49e);
  std::allocator<char>::~allocator(&local_49d);
  std::allocator<char>::~allocator(&local_49c);
  std::allocator<char>::~allocator(&local_49b);
  std::allocator<char>::~allocator(&local_49a);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::~allocator(&local_498);
  std::allocator<char>::~allocator(&local_497);
  std::allocator<char>::~allocator(&local_496);
  std::allocator<char>::~allocator(local_495);
  std::allocator<char>::~allocator(&local_481);
  std::__cxx11::string::string(local_4e0,(string *)&this->working);
  uVar3 = wasm::file_size(local_4e0);
  std::__cxx11::string::~string(local_4e0);
  bVar1 = true;
  local_4c0 = uVar3;
  while (bVar1) {
    bVar1 = false;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_28);
    pass.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_28);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)((long)&pass.field_2 + 8)), bVar2) {
      pbVar4 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end2);
      std::__cxx11::string::string
                ((string *)(currCommand.field_2._M_local_buf + 8),(string *)pbVar4);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_580,"wasm-opt",&local_581);
      wasm::Path::getBinaryenBinaryTool((string *)&local_560);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540,
                     &local_560," ");
      std::__cxx11::string::~string((string *)&local_560);
      std::__cxx11::string::~string(local_580);
      std::allocator<char>::~allocator(&local_581);
      std::operator+(&local_648,&this->working," -o ");
      std::operator+(&local_628,&local_648,&this->test);
      std::operator+(&local_608,&local_628," ");
      std::operator+(&local_5e8,&local_608,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&currCommand.field_2 + 8));
      std::operator+(&local_5c8,&local_5e8," ");
      std::operator+(&local_5a8,&local_5c8,&extraFlags_abi_cxx11_);
      std::__cxx11::string::operator+=((string *)local_540,(string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_5a8);
      std::__cxx11::string::~string((string *)&local_5c8);
      std::__cxx11::string::~string((string *)&local_5e8);
      std::__cxx11::string::~string((string *)&local_608);
      std::__cxx11::string::~string((string *)&local_628);
      std::__cxx11::string::~string((string *)&local_648);
      if ((this->binary & 1U) == 0) {
        std::__cxx11::string::operator+=((string *)local_540," -S ");
      }
      if ((this->verbose & 1U) != 0) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"|    trying pass command: ");
        poVar5 = std::operator<<(poVar5,(string *)local_540);
        std::operator<<(poVar5,"\n");
      }
      std::__cxx11::string::string((string *)&newSize,(string *)local_540);
      ProgramResult::ProgramResult(&local_678,(string *)&newSize);
      bVar2 = ProgramResult::failed(&local_678);
      ProgramResult::~ProgramResult(&local_678);
      std::__cxx11::string::~string((string *)&newSize);
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        std::__cxx11::string::string(local_6c0,(string *)&this->test);
        uVar3 = wasm::file_size(local_6c0);
        std::__cxx11::string::~string(local_6c0);
        local_6a0 = uVar3;
        if (uVar3 < local_4c0) {
          std::__cxx11::string::string((string *)&local_710,(string *)&this->command);
          ProgramResult::ProgramResult(&local_6f0,&local_710);
          bVar2 = ProgramResult::operator==(&local_6f0,&expected);
          ProgramResult::~ProgramResult(&local_6f0);
          std::__cxx11::string::~string((string *)&local_710);
          if (bVar2) {
            poVar5 = std::operator<<((ostream *)&std::cerr,"|    command \"");
            poVar5 = std::operator<<(poVar5,(string *)local_540);
            poVar5 = std::operator<<(poVar5,"\" succeeded, reduced size to ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_6a0);
            std::operator<<(poVar5,'\n');
            std::__cxx11::string::string(local_730,(string *)&this->test);
            std::__cxx11::string::string(local_750,(string *)&this->working);
            wasm::copy_file(local_730,local_750);
            std::__cxx11::string::~string(local_750);
            std::__cxx11::string::~string(local_730);
            bVar1 = true;
            local_4c0 = local_6a0;
          }
        }
      }
      std::__cxx11::string::~string((string *)local_540);
      std::__cxx11::string::~string((string *)(currCommand.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  if ((this->verbose & 1U) != 0) {
    std::operator<<((ostream *)&std::cerr,"|    done with passes for now\n");
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_28);
  return;
}

Assistant:

void reduceUsingPasses() {
    // run optimization passes until we can't shrink it any more
    std::vector<std::string> passes = {
      "-Oz",
      "-Os",
      "-O1",
      "-O2",
      "-O3",
      "-O4",
      "--flatten -Os",
      "--flatten -O3",
      "--flatten --simplify-locals-notee-nostructure --local-cse -Os",
      "--coalesce-locals --vacuum",
      "--dae",
      "--dae-optimizing",
      "--dce",
      "--duplicate-function-elimination",
      "--gto",
      "--inlining",
      "--inlining-optimizing",
      "--optimize-level=3 --inlining-optimizing",
      "--local-cse",
      "--memory-packing",
      "--remove-unused-names --merge-blocks --vacuum",
      "--optimize-instructions",
      "--precompute",
      "--remove-imports",
      "--remove-memory",
      "--remove-unused-names --remove-unused-brs",
      "--remove-unused-module-elements",
      "--remove-unused-nonfunction-module-elements",
      "--reorder-functions",
      "--reorder-locals",
      // TODO: signature* passes
      "--simplify-globals",
      "--simplify-locals --vacuum",
      "--strip",
      "--vacuum"};
    auto oldSize = file_size(working);
    bool more = true;
    while (more) {
      // std::cerr << "|    starting passes loop iteration\n";
      more = false;
      // try both combining with a generic shrink (so minor pass overhead is
      // compensated for), and without
      for (auto pass : passes) {
        std::string currCommand = Path::getBinaryenBinaryTool("wasm-opt") + " ";
        currCommand += working + " -o " + test + " " + pass + " " + extraFlags;
        if (!binary) {
          currCommand += " -S ";
        }
        if (verbose) {
          std::cerr << "|    trying pass command: " << currCommand << "\n";
        }
        if (!ProgramResult(currCommand).failed()) {
          auto newSize = file_size(test);
          if (newSize < oldSize) {
            // the pass didn't fail, and the size looks smaller, so promising
            // see if it is still has the property we are preserving
            if (ProgramResult(command) == expected) {
              std::cerr << "|    command \"" << currCommand
                        << "\" succeeded, reduced size to " << newSize << '\n';
              copy_file(test, working);
              more = true;
              oldSize = newSize;
            }
          }
        }
      }
    }
    if (verbose) {
      std::cerr << "|    done with passes for now\n";
    }
  }